

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_steam.cpp
# Opt level: O2

void PSR_FindEndBlock(FScanner *sc)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = 1;
  do {
    bVar1 = FScanner::CheckToken(sc,0x7d);
    if (bVar1) {
      iVar2 = iVar2 + -1;
    }
    else {
      bVar1 = FScanner::CheckToken(sc,0x7b);
      if (bVar1) {
        iVar2 = iVar2 + 1;
      }
      else {
        FScanner::MustGetAnyToken(sc);
      }
    }
  } while (iVar2 != 0);
  return;
}

Assistant:

static void PSR_FindEndBlock(FScanner &sc)
{
	int depth = 1;
	do
	{
		if(sc.CheckToken('}'))
			--depth;
		else if(sc.CheckToken('{'))
			++depth;
		else
			sc.MustGetAnyToken();
	}
	while(depth);
}